

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O2

int __thiscall Ruleset::getHighestCardID(Ruleset *this,vector<Card,_std::allocator<Card>_> *cards)

{
  pointer ppRVar1;
  uint uVar2;
  ulong uVar3;
  pointer ppRVar4;
  
  ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (ppRVar4 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppRVar4 != ppRVar1; ppRVar4 = ppRVar4 + 1) {
    uVar2 = (*(*ppRVar4)->_vptr_Rule[1])(*ppRVar4,uVar3,cards);
    uVar3 = (ulong)uVar2;
  }
  return (int)uVar3;
}

Assistant:

int Ruleset::getHighestCardID(const std::vector<Card> &cards) {
    int previous = 0;
    for(auto rule : m_ruleInstances){
        previous = rule->getHighestCardID(previous, cards);
    }
    return previous;
}